

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QCalendarWidgetPrivate::update(QCalendarWidgetPrivate *this)

{
  long in_FS_OFFSET;
  int column;
  int row;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = -0x55555556;
  local_28 = -0x55555556;
  QtPrivate::QCalendarModel::cellForDate
            (this->m_model,(QDate)(this->m_model->m_date).jd,&local_24,&local_28);
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)this->m_selection + 0x78))();
  if (local_28 != -1 && local_24 != -1) {
    (**(code **)(*(long *)this->m_model + 0x60))(&local_40);
    (**(code **)(*(long *)this->m_selection + 0x60))(this->m_selection,&local_40,0x12);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::update()
{
    QDate currentDate = m_model->m_date;
    int row, column;
    m_model->cellForDate(currentDate, &row, &column);
    QModelIndex idx;
    m_selection->clear();
    if (row != -1 && column != -1) {
        idx = m_model->index(row, column);
        m_selection->setCurrentIndex(idx, QItemSelectionModel::SelectCurrent);
    }
}